

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evpath_dp.c
# Opt level: O3

int EvpathWaitForCompletion(CP_Services Svcs,void *Handle_v)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  void *pvVar4;
  undefined8 *puVar5;
  char *pcVar6;
  int iVar7;
  long lVar8;
  
  if (*Handle_v != -1) {
    (*Svcs->verbose)(*(void **)((long)Handle_v + 0x10),5,
                     "Waiting for completion of memory read to rank %d, condition %d\n",
                     (ulong)*(uint *)((long)Handle_v + 0x2c));
    if (*Handle_v != -1) {
      CMCondition_wait(*(undefined8 *)((long)Handle_v + 8));
    }
  }
  if (*(int *)((long)Handle_v + 0x28) == 0) {
    uVar2 = *Handle_v;
    iVar7 = 1;
    if (uVar2 == 0xffffffff) goto LAB_0010ad94;
    pvVar4 = *(void **)((long)Handle_v + 0x10);
    uVar1 = *(uint *)((long)Handle_v + 0x2c);
    pcVar6 = "Remote memory read to rank %d with condition %d has completed\n";
  }
  else {
    pvVar4 = *(void **)((long)Handle_v + 0x10);
    uVar1 = *(uint *)((long)Handle_v + 0x2c);
    uVar2 = *Handle_v;
    pcVar6 = 
    "Remote memory read to rank %d with condition %d has FAILED because of writer failure\n";
    iVar7 = 0;
  }
  (*Svcs->verbose)(pvVar4,5,pcVar6,(ulong)uVar1,(ulong)uVar2);
LAB_0010ad94:
  pthread_mutex_lock((pthread_mutex_t *)(*(long *)((long)Handle_v + 0x18) + 0x18));
  lVar8 = *(long *)((long)Handle_v + 0x18);
  pvVar4 = *(void **)(lVar8 + 0x58);
  if (*(void **)(lVar8 + 0x58) == Handle_v) {
    puVar5 = (undefined8 *)(lVar8 + 0x58);
    pvVar4 = Handle_v;
  }
  else {
    do {
      pvVar3 = pvVar4;
      if (pvVar3 == (void *)0x0) goto LAB_0010adda;
      pvVar4 = *(void **)((long)pvVar3 + 0x40);
    } while (pvVar4 != Handle_v);
    puVar5 = (undefined8 *)((long)pvVar3 + 0x40);
  }
  *puVar5 = *(undefined8 *)((long)pvVar4 + 0x40);
  lVar8 = *(long *)((long)Handle_v + 0x18);
LAB_0010adda:
  pthread_mutex_unlock((pthread_mutex_t *)(lVar8 + 0x18));
  free(Handle_v);
  return iVar7;
}

Assistant:

static int EvpathWaitForCompletion(CP_Services Svcs, void *Handle_v)
{
    EvpathCompletionHandle Handle = (EvpathCompletionHandle)Handle_v;
    int Ret = 1;
    if (Handle->CMcondition != -1)
        Svcs->verbose(Handle->CPStream, DPTraceVerbose,
                      "Waiting for completion of memory read to rank %d, condition %d\n",
                      Handle->Rank, Handle->CMcondition);
    /*
     * Wait for the CM condition to be signalled.  If it has been already,
     * this returns immediately.  Copying the incoming data to the waiting
     * buffer has been done by the reply handler.
     */
    if (Handle->CMcondition != -1)
        CMCondition_wait(Handle->cm, Handle->CMcondition);
    if (Handle->Failed)
    {
        Svcs->verbose(Handle->CPStream, DPTraceVerbose,
                      "Remote memory read to rank %d with "
                      "condition %d has FAILED because of "
                      "writer failure\n",
                      Handle->Rank, Handle->CMcondition);
        Ret = 0;
    }
    else
    {
        if (Handle->CMcondition != -1)
            Svcs->verbose(Handle->CPStream, DPTraceVerbose,
                          "Remote memory read to rank %d with condition %d has "
                          "completed\n",
                          Handle->Rank, Handle->CMcondition);
    }
    pthread_mutex_lock(&((Evpath_RS_Stream)Handle->DPStream)->DataLock);
    RemoveRequestFromList(Svcs, Handle->DPStream, Handle);
    pthread_mutex_unlock(&((Evpath_RS_Stream)Handle->DPStream)->DataLock);
    free(Handle);
    return Ret;
}